

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

void __thiscall Core::setup(Core *this)

{
  bool bVar1;
  ostream *poVar2;
  string *s;
  _Alloc_hider _Var3;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"rsrc/amaya_header.txt",&local_41);
  bVar1 = Parsing::File::setPath(&this->_f,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    Parsing::File::getContent_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_40,&this->_f);
    for (_Var3._M_p = local_40._M_dataplus._M_p; _Var3._M_p != (pointer)local_40._M_string_length;
        _Var3._M_p = _Var3._M_p + 0x20) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)_Var3._M_p);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_40);
  }
  return;
}

Assistant:

void Core::setup()
{
    if (!_f.setPath("rsrc/amaya_header.txt"))
        return;
    for (const std::string &s : _f.getContent())
        std::cout << s << std::endl;
}